

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

int curlSocketCallback(CURL *easy,curl_socket_t s,int action,void *userp,void *socketp)

{
  if ((action & 0xfffffffdU) == 1) {
    addFd((Sockets *)userp,s,"read");
  }
  if ((action & 0xfffffffeU) == 2) {
    addFd((Sockets *)((long)userp + 0x10),s,"write");
  }
  else if (action == 4) {
    removeFd((Sockets *)userp,s,1);
    removeFd((Sockets *)((long)userp + 0x10),s,0);
  }
  return 0;
}

Assistant:

static int curlSocketCallback(CURL *easy, curl_socket_t s, int action,
                              void *userp, void *socketp)
{
  struct ReadWriteSockets* sockets = userp;

  (void)easy; /* unused */
  (void)socketp; /* unused */

  if(action == CURL_POLL_IN || action == CURL_POLL_INOUT)
    addFd(&sockets->read, s, "read");

  if(action == CURL_POLL_OUT || action == CURL_POLL_INOUT)
    addFd(&sockets->write, s, "write");

  if(action == CURL_POLL_REMOVE) {
    removeFd(&sockets->read, s, 1);
    removeFd(&sockets->write, s, 0);
  }

  return 0;
}